

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall soul::StructuralParser::parseConnectionPoint(StructuralParser *this)

{
  char *pcVar1;
  DestructorFn *pDVar2;
  undefined8 uVar3;
  int iVar4;
  QualifiedIdentifier *nameOrTargetType;
  CommaSeparatedList *this_00;
  PoolItem *pPVar5;
  CommaSeparatedList *this_01;
  pool_ptr<soul::AST::Expression> e;
  Context errorPos;
  undefined1 local_80 [16];
  UTF8Reader local_70;
  Ptr local_68;
  CompileMessage local_60;
  
  local_80._8_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
  if ((SourceCodeText *)local_80._8_8_ != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_80._8_8_)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_80._8_8_)->super_RefCountedObject).refCount + 1;
  }
  pcVar1 = (this->super_SOULTokeniser).location.location.data;
  local_68.object = (SourceCodeText *)this->currentScope;
  local_70.data = pcVar1;
  tryToParseExpressionIgnoringErrors((StructuralParser *)local_80);
  this_01 = (CommaSeparatedList *)local_80._0_8_;
  if ((CommaSeparatedList *)local_80._0_8_ == (CommaSeparatedList *)0x0) {
    if ((this->super_SOULTokeniser).input.data != pcVar1) {
      (this->super_SOULTokeniser).input.data = pcVar1;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::skip(&this->super_SOULTokeniser);
    }
    pcVar1 = (this->super_SOULTokeniser).currentType.text;
    if (pcVar1 != "$identifier") {
      if (pcVar1 == (char *)0x0) {
LAB_0020466a:
        CompileMessageHelpers::createMessage<>
                  (&local_60,syntax,error,"Expected a processor name or endpoint");
        AST::Context::throwError((Context *)(local_80 + 8),&local_60,false);
      }
      iVar4 = strcmp(pcVar1,"$identifier");
      if (iVar4 != 0) goto LAB_0020466a;
    }
    nameOrTargetType = parseQualifiedIdentifier(this);
    parseSpecialisationArgs((StructuralParser *)local_80);
    if ((CommaSeparatedList *)local_80._0_8_ == (CommaSeparatedList *)0x0) {
      this_00 = (CommaSeparatedList *)0x0;
    }
    else {
      if ((CommaSeparatedList *)local_80._0_8_ == (CommaSeparatedList *)0x0) {
        this_00 = (CommaSeparatedList *)0x0;
      }
      else {
        this_00 = (CommaSeparatedList *)
                  __dynamic_cast(local_80._0_8_,&AST::Expression::typeinfo,
                                 &AST::CommaSeparatedList::typeinfo);
      }
      uVar3 = local_80._0_8_;
      if (this_00 == (CommaSeparatedList *)0x0) {
        if ((CommaSeparatedList *)local_80._0_8_ == (CommaSeparatedList *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        pPVar5 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x68);
        this_00 = (CommaSeparatedList *)&pPVar5->item;
        AST::CommaSeparatedList::CommaSeparatedList
                  (this_00,&(((Expression *)uVar3)->super_Statement).super_ASTObject.context);
        pPVar5->destructor =
             PoolAllocator::allocate<soul::AST::CommaSeparatedList,_soul::AST::Context_&>::
             anon_class_1_0_00000001::__invoke;
        if ((CommaSeparatedList *)local_80._0_8_ == (CommaSeparatedList *)0x0) {
          throwInternalCompilerError("object != nullptr","operator*",0x3b);
        }
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                   (pPVar5 + 2),(size_t)(pPVar5[2].destructor + 1));
        pDVar2 = pPVar5[2].destructor;
        *(undefined8 *)(pPVar5[2].size + (long)pDVar2 * 8) = local_80._0_8_;
        pPVar5[2].destructor = pDVar2 + 1;
      }
    }
    pPVar5 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x48);
    this_01 = (CommaSeparatedList *)&pPVar5->item;
    local_80._0_8_ = this_00;
    AST::CallOrCast::CallOrCast
              ((CallOrCast *)this_01,&nameOrTargetType->super_Expression,
               (pool_ptr<soul::AST::CommaSeparatedList> *)local_80,false);
    pPVar5->destructor =
         PoolAllocator::
         allocate<soul::AST::CallOrCast,_soul::AST::QualifiedIdentifier_&,_soul::pool_ptr<soul::AST::CommaSeparatedList>_&,_bool>
         ::anon_class_1_0_00000001::__invoke;
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_80._8_8_);
  return &this_01->super_Expression;
}

Assistant:

AST::Expression& parseConnectionPoint()
    {
        auto errorPos = getContext();
        auto startPos = getCurrentTokeniserPosition();

        if (auto e = tryToParseExpressionIgnoringErrors())
            return *e;

        resetPosition (startPos);

        if (! matches (Token::identifier))
            errorPos.throwError (Errors::expectedProcessorOrEndpoint());

        auto& processorName = parseQualifiedIdentifier();
        pool_ptr<AST::CommaSeparatedList> args;

        if (auto specialisationArgs = parseSpecialisationArgs())
        {
            args = cast<AST::CommaSeparatedList> (specialisationArgs);

            if (args == nullptr)
            {
                args = allocate<AST::CommaSeparatedList> (specialisationArgs->context);
                args->items.push_back (*specialisationArgs);
            }
        }

        return allocate<AST::CallOrCast> (processorName, args, false);
    }